

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O2

bool IsValidSignatureEncoding(vector<unsigned_char,_std::allocator<unsigned_char>_> *sig)

{
  byte bVar1;
  byte bVar2;
  pointer puVar3;
  bool bVar4;
  ulong uVar5;
  uint uVar6;
  long in_FS_OFFSET;
  
  puVar3 = (sig->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar5 = (long)(sig->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)puVar3;
  if (((0xffffffffffffffbe < uVar5 - 0x4a) && (*puVar3 == '0')) && (uVar5 - 3 == (ulong)puVar3[1]))
  {
    bVar1 = puVar3[3];
    if ((ulong)bVar1 + 5 < uVar5) {
      bVar2 = puVar3[(ulong)bVar1 + 5];
      if (uVar5 == (uint)bVar1 + (uint)bVar2 + 7) {
        bVar4 = false;
        if ((bVar1 == 0) || (bVar4 = false, puVar3[2] != '\x02')) goto LAB_001dba96;
        if (-1 < (char)puVar3[4]) {
          uVar6 = (uint)bVar1;
          if ((puVar3[4] != '\0' || uVar6 == 1) || ((char)puVar3[5] < '\0')) {
            bVar4 = false;
            if ((bVar2 == 0) || (puVar3[(ulong)uVar6 + 4] != '\x02')) goto LAB_001dba96;
            if ((-1 < (char)puVar3[(ulong)uVar6 + 6]) &&
               (((bVar2 == 1 || (puVar3[(ulong)uVar6 + 6] != '\0')) ||
                ((char)puVar3[(ulong)uVar6 + 7] < '\0')))) {
              bVar4 = true;
              goto LAB_001dba96;
            }
          }
        }
      }
    }
  }
  bVar4 = false;
LAB_001dba96:
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool static IsValidSignatureEncoding(const std::vector<unsigned char> &sig) {
    // Format: 0x30 [total-length] 0x02 [R-length] [R] 0x02 [S-length] [S] [sighash]
    // * total-length: 1-byte length descriptor of everything that follows,
    //   excluding the sighash byte.
    // * R-length: 1-byte length descriptor of the R value that follows.
    // * R: arbitrary-length big-endian encoded R value. It must use the shortest
    //   possible encoding for a positive integer (which means no null bytes at
    //   the start, except a single one when the next byte has its highest bit set).
    // * S-length: 1-byte length descriptor of the S value that follows.
    // * S: arbitrary-length big-endian encoded S value. The same rules apply.
    // * sighash: 1-byte value indicating what data is hashed (not part of the DER
    //   signature)

    // Minimum and maximum size constraints.
    if (sig.size() < 9) return false;
    if (sig.size() > 73) return false;

    // A signature is of type 0x30 (compound).
    if (sig[0] != 0x30) return false;

    // Make sure the length covers the entire signature.
    if (sig[1] != sig.size() - 3) return false;

    // Extract the length of the R element.
    unsigned int lenR = sig[3];

    // Make sure the length of the S element is still inside the signature.
    if (5 + lenR >= sig.size()) return false;

    // Extract the length of the S element.
    unsigned int lenS = sig[5 + lenR];

    // Verify that the length of the signature matches the sum of the length
    // of the elements.
    if ((size_t)(lenR + lenS + 7) != sig.size()) return false;

    // Check whether the R element is an integer.
    if (sig[2] != 0x02) return false;

    // Zero-length integers are not allowed for R.
    if (lenR == 0) return false;

    // Negative numbers are not allowed for R.
    if (sig[4] & 0x80) return false;

    // Null bytes at the start of R are not allowed, unless R would
    // otherwise be interpreted as a negative number.
    if (lenR > 1 && (sig[4] == 0x00) && !(sig[5] & 0x80)) return false;

    // Check whether the S element is an integer.
    if (sig[lenR + 4] != 0x02) return false;

    // Zero-length integers are not allowed for S.
    if (lenS == 0) return false;

    // Negative numbers are not allowed for S.
    if (sig[lenR + 6] & 0x80) return false;

    // Null bytes at the start of S are not allowed, unless S would otherwise be
    // interpreted as a negative number.
    if (lenS > 1 && (sig[lenR + 6] == 0x00) && !(sig[lenR + 7] & 0x80)) return false;

    return true;
}